

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

bool __thiscall re2::DFA::AnalyzeSearch(DFA *this,SearchParams *params)

{
  const_pointer pcVar1;
  const_pointer pcVar2;
  uint8_t c;
  bool bVar3;
  uint uVar4;
  uint8_t *puVar5;
  uint32_t flags;
  StartInfo *info;
  LogMessage local_1a0;
  
  pcVar1 = (params->text).data_;
  pcVar2 = (params->context).data_;
  if (pcVar1 < pcVar2) {
LAB_001a350d:
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/dfa.cc"
               ,0x674);
    std::operator<<((ostream *)&local_1a0.str_,"context does not contain text");
    LogMessage::~LogMessage(&local_1a0);
    params->start = (State *)0x1;
    return true;
  }
  puVar5 = (uint8_t *)(pcVar1 + (params->text).size_);
  if (pcVar2 + (params->context).size_ < puVar5) goto LAB_001a350d;
  if (params->run_forward == true) {
    if (pcVar1 == pcVar2) {
LAB_001a3571:
      flags = 5;
      uVar4 = 0;
      goto LAB_001a3593;
    }
    c = pcVar1[-1];
  }
  else {
    if (puVar5 == (uint8_t *)(pcVar2 + (params->context).size_)) goto LAB_001a3571;
    c = *puVar5;
  }
  if (c == '\n') {
    flags = 1;
    uVar4 = 2;
  }
  else {
    bVar3 = Prog::IsWordChar(c);
    uVar4 = (uint)!bVar3 * 2 + 4;
    flags = (uint)bVar3 << 9;
  }
LAB_001a3593:
  uVar4 = (uVar4 | params->anchored) << 4;
  info = (StartInfo *)((long)&this->start_[0].start + (ulong)uVar4);
  bVar3 = AnalyzeSearchHelper(this,params,info,flags);
  if (!bVar3) {
    ResetCache(this,params->cache_lock);
    bVar3 = AnalyzeSearchHelper(this,params,info,flags);
    if (!bVar3) {
      LogMessage::LogMessage
                (&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/dfa.cc"
                 ,0x6a3);
      std::operator<<((ostream *)&local_1a0.str_,"Failed to analyze start state.");
      LogMessage::~LogMessage(&local_1a0);
      params->failed = true;
      return false;
    }
  }
  params->start = info->start;
  params->first_byte =
       *(int *)((long)&this->start_[0].first_byte.super___atomic_base<int>._M_i + (ulong)uVar4);
  return true;
}

Assistant:

bool DFA::AnalyzeSearch(SearchParams* params) {
  const StringPiece& text = params->text;
  const StringPiece& context = params->context;

  // Sanity check: make sure that text lies within context.
  if (text.begin() < context.begin() || text.end() > context.end()) {
    LOG(DFATAL) << "context does not contain text";
    params->start = DeadState;
    return true;
  }

  // Determine correct search type.
  int start;
  uint32_t flags;
  if (params->run_forward) {
    if (text.begin() == context.begin()) {
      start = kStartBeginText;
      flags = kEmptyBeginText|kEmptyBeginLine;
    } else if (text.begin()[-1] == '\n') {
      start = kStartBeginLine;
      flags = kEmptyBeginLine;
    } else if (Prog::IsWordChar(text.begin()[-1] & 0xFF)) {
      start = kStartAfterWordChar;
      flags = kFlagLastWord;
    } else {
      start = kStartAfterNonWordChar;
      flags = 0;
    }
  } else {
    if (text.end() == context.end()) {
      start = kStartBeginText;
      flags = kEmptyBeginText|kEmptyBeginLine;
    } else if (text.end()[0] == '\n') {
      start = kStartBeginLine;
      flags = kEmptyBeginLine;
    } else if (Prog::IsWordChar(text.end()[0] & 0xFF)) {
      start = kStartAfterWordChar;
      flags = kFlagLastWord;
    } else {
      start = kStartAfterNonWordChar;
      flags = 0;
    }
  }
  if (params->anchored)
    start |= kStartAnchored;
  StartInfo* info = &start_[start];

  // Try once without cache_lock for writing.
  // Try again after resetting the cache
  // (ResetCache will relock cache_lock for writing).
  if (!AnalyzeSearchHelper(params, info, flags)) {
    ResetCache(params->cache_lock);
    if (!AnalyzeSearchHelper(params, info, flags)) {
      LOG(DFATAL) << "Failed to analyze start state.";
      params->failed = true;
      return false;
    }
  }

  if (ExtraDebug)
    fprintf(stderr, "anchored=%d fwd=%d flags=%#x state=%s first_byte=%d\n",
            params->anchored, params->run_forward, flags,
            DumpState(info->start).c_str(), info->first_byte.load());

  params->start = info->start;
  params->first_byte = info->first_byte.load(std::memory_order_acquire);

  return true;
}